

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# suite.c
# Opt level: O2

void add_tests_(TestSuite *suite,char *names,...)

{
  char in_AL;
  int iVar1;
  CgreenVector *vector;
  char *name;
  undefined8 in_RCX;
  void **ppvVar2;
  uint uVar3;
  undefined8 in_RDX;
  ulong uVar4;
  int position;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list tests;
  void **local_f0;
  void *local_d8 [4];
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  
  if (in_AL != '\0') {
    local_a8 = in_XMM0_Qa;
    local_98 = in_XMM1_Qa;
    local_88 = in_XMM2_Qa;
    local_78 = in_XMM3_Qa;
    local_68 = in_XMM4_Qa;
    local_58 = in_XMM5_Qa;
    local_48 = in_XMM6_Qa;
    local_38 = in_XMM7_Qa;
  }
  local_d8[2] = (void *)in_RDX;
  local_d8[3] = (void *)in_RCX;
  local_b8 = in_R8;
  local_b0 = in_R9;
  vector = create_vector_of_names(names);
  local_f0 = &tests[0].overflow_arg_area;
  uVar3 = 0x10;
  position = 0;
  while( true ) {
    iVar1 = cgreen_vector_size(vector);
    if (iVar1 <= position) break;
    name = (char *)cgreen_vector_get(vector,position);
    uVar4 = (ulong)uVar3;
    if (uVar4 < 0x29) {
      uVar3 = uVar3 + 8;
      ppvVar2 = (void **)((long)local_d8 + uVar4);
    }
    else {
      ppvVar2 = local_f0;
      local_f0 = local_f0 + 1;
    }
    add_test_(suite,name,(CgreenTest *)*ppvVar2);
    position = position + 1;
  }
  destroy_cgreen_vector(vector);
  return;
}

Assistant:

void add_tests_(TestSuite *suite, const char *names, ...) {
    CgreenVector *test_names = create_vector_of_names(names);
    int i;
    va_list tests;
    va_start(tests, names);
    for (i = 0; i < cgreen_vector_size(test_names); i++) {
        add_test_(suite, (char *)(cgreen_vector_get(test_names, i)), va_arg(tests, CgreenTest *));
    }
    va_end(tests);
    destroy_cgreen_vector(test_names);
}